

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

DeviceType Diligent::DearchiverBase::GetArchiveDeviceType(IRenderDevice *pDevice)

{
  DeviceType DVar1;
  Char *Message;
  RENDER_DEVICE_TYPE *pRVar2;
  char (*in_RCX) [19];
  RENDER_DEVICE_TYPE Type;
  undefined1 local_30 [8];
  string msg;
  IRenderDevice *pDevice_local;
  
  msg.field_2._8_8_ = pDevice;
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcc143e,
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetArchiveDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,99);
    std::__cxx11::string::~string((string *)local_30);
  }
  pRVar2 = (RENDER_DEVICE_TYPE *)(**(code **)(*(long *)msg.field_2._8_8_ + 0xc0))();
  DVar1 = RenderDeviceTypeToArchiveDeviceType(*pRVar2);
  return DVar1;
}

Assistant:

DearchiverBase::DeviceType DearchiverBase::GetArchiveDeviceType(const IRenderDevice* pDevice)
{
    VERIFY_EXPR(pDevice != nullptr);
    const RENDER_DEVICE_TYPE Type = pDevice->GetDeviceInfo().Type;
    return RenderDeviceTypeToArchiveDeviceType(Type);
}